

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::DeviceContextVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator=
          (RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this,DeviceContextVkImpl *pObj)

{
  DeviceContextVkImpl *pObj_local;
  RefCntAutoPtr<Diligent::DeviceContextVkImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (DeviceContextVkImpl *)0x0) {
      RefCountedObject<Diligent::IDeviceContextVk>::Release
                ((RefCountedObject<Diligent::IDeviceContextVk> *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (DeviceContextVkImpl *)0x0) {
      RefCountedObject<Diligent::IDeviceContextVk>::AddRef
                ((RefCountedObject<Diligent::IDeviceContextVk> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }